

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse2_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  long *plVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  uint uVar12;
  parasail_result_t *ppVar13;
  __m128i *palVar14;
  __m128i *ptr;
  __m128i *ptr_00;
  int64_t *ptr_01;
  ulong uVar15;
  long lVar16;
  longlong *plVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  longlong *plVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  bool bVar32;
  long lVar33;
  ulong uVar34;
  __m128i *ptr_02;
  uint uVar35;
  ulong size;
  long lVar36;
  bool bVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined4 uVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  longlong lVar51;
  __m128i_64_t A_1;
  int iVar53;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_64_t A;
  undefined1 auVar69 [16];
  __m128i_64_t B_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  long lVar73;
  __m128i_64_t B;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  __m128i_64_t B_4;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  int iVar90;
  undefined1 auVar85 [16];
  int iVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  int iVar96;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  int iVar97;
  undefined1 auVar95 [16];
  int iVar102;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int iVar103;
  int iVar104;
  undefined1 auVar101 [16];
  int iVar108;
  undefined1 auVar105 [16];
  int iVar109;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  __m128i_64_t e;
  __m128i_64_t h;
  int local_110;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  long local_48;
  undefined8 uStack_40;
  int64_t iVar79;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_striped_profile_sse2_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_table_striped_profile_sse2_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_striped_profile_sse2_128_64_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_table_striped_profile_sse2_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_striped_profile_sse2_128_64_cold_4();
        }
        else {
          uVar29 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sg_flags_table_striped_profile_sse2_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sg_flags_table_striped_profile_sse2_128_64_cold_1();
          }
          else {
            uVar30 = uVar2 - 1;
            uVar23 = (ulong)uVar2 + 1;
            size = uVar23 >> 1;
            uVar7 = (ulong)uVar30 % size;
            uVar24 = (ulong)(uint)open;
            iVar19 = -open;
            iVar25 = ppVar4->min;
            uVar34 = 0x8000000000000000 - (long)iVar25;
            if (iVar25 != iVar19 && SBORROW4(iVar25,iVar19) == iVar25 + open < 0) {
              uVar34 = uVar24 | 0x8000000000000000;
            }
            iVar25 = ppVar4->max;
            uVar35 = (uint)size;
            iVar53 = (int)(uVar30 / size);
            ppVar13 = parasail_result_new_table1((uint)uVar23 & 0x7ffffffe,s2Len);
            if (ppVar13 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            ppVar13->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x2820802;
            palVar14 = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
            auVar67._0_4_ = -(uint)((int)((ulong)palVar14 >> 0x20) == 0 && (int)palVar14 == 0);
            auVar67._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar67._8_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0 && (int)ptr_00 == 0);
            auVar67._12_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
            iVar20 = movmskps((int)palVar14,auVar67);
            if (iVar20 == 0) {
              iVar20 = s2Len + -1;
              uVar15 = uVar34 + 1;
              local_48 = 0x7ffffffffffffffe - (long)iVar25;
              auVar39._8_4_ = (int)uVar15;
              auVar39._0_8_ = uVar15;
              auVar39._12_4_ = (int)(uVar15 >> 0x20);
              uStack_40 = 0;
              uVar45 = (undefined4)((ulong)local_48 >> 0x20);
              auVar40._8_4_ = (int)local_48;
              auVar40._0_8_ = local_48;
              auVar40._12_4_ = uVar45;
              auVar65._8_8_ = -(ulong)(iVar53 == 1);
              auVar65._0_8_ = -(ulong)(uVar30 < uVar35);
              lVar16 = (long)iVar19;
              uVar28 = 0;
              do {
                lVar36 = 0;
                plVar17 = &local_68;
                plVar21 = &local_58;
                bVar37 = true;
                do {
                  bVar32 = bVar37;
                  if (s1_beg == 0) {
                    lVar36 = lVar16 - (lVar36 * size + uVar28) * (ulong)(uint)gap;
                  }
                  else {
                    lVar36 = 0;
                  }
                  *plVar21 = lVar36;
                  *plVar17 = lVar36 - uVar24;
                  lVar36 = 1;
                  plVar17 = &lStack_60;
                  plVar21 = &lStack_50;
                  bVar37 = false;
                } while (bVar32);
                palVar14[uVar28][0] = local_58;
                palVar14[uVar28][1] = lStack_50;
                ptr_00[uVar28][0] = local_68;
                ptr_00[uVar28][1] = lStack_60;
                uVar28 = uVar28 + 1;
              } while (uVar28 != size);
              *ptr_01 = 0;
              auVar69 = _DAT_00903aa0;
              auVar67 = _DAT_00903a90;
              lVar36 = uVar29 - 1;
              auVar54._8_4_ = (int)lVar36;
              auVar54._0_8_ = lVar36;
              auVar54._12_4_ = (int)((ulong)lVar36 >> 0x20);
              auVar54 = auVar54 ^ _DAT_00903aa0;
              uVar28 = 0;
              do {
                auVar74._8_4_ = (int)uVar28;
                auVar74._0_8_ = uVar28;
                auVar74._12_4_ = (int)(uVar28 >> 0x20);
                auVar74 = (auVar74 | auVar67) ^ auVar69;
                if ((bool)(~(auVar74._4_4_ == auVar54._4_4_ && auVar54._0_4_ < auVar74._0_4_ ||
                            auVar54._4_4_ < auVar74._4_4_) & 1)) {
                  iVar25 = 0;
                  if (s2_beg == 0) {
                    iVar25 = iVar19;
                  }
                  ptr_01[uVar28 + 1] = (long)iVar25;
                }
                if ((auVar74._12_4_ != auVar54._12_4_ || auVar74._8_4_ <= auVar54._8_4_) &&
                    auVar74._12_4_ <= auVar54._12_4_) {
                  iVar25 = iVar19 - gap;
                  if (s2_beg != 0) {
                    iVar25 = 0;
                  }
                  ptr_01[uVar28 + 2] = (long)iVar25;
                }
                auVar74 = _DAT_00904920;
                uVar28 = uVar28 + 2;
                iVar19 = iVar19 + gap * -2;
              } while ((s2Len + 1U & 0xfffffffe) != uVar28);
              lVar33 = size * uVar29 * 4;
              lVar36 = 0;
              uVar28 = 0;
              auVar67 = auVar39;
              auVar69 = auVar39;
              local_110 = iVar20;
              do {
                ptr_02 = ptr;
                ptr = palVar14;
                iVar25 = ppVar4->mapper[(byte)s2[uVar28]];
                iVar79 = ptr_01[uVar28];
                lVar51 = ptr[uVar35 - 1][0];
                lVar18 = 0;
                lVar22 = lVar36;
                auVar72 = auVar39;
                do {
                  plVar1 = (long *)((long)pvVar3 + lVar18 + (long)iVar25 * (long)(int)uVar35 * 0x10)
                  ;
                  auVar80._0_8_ = iVar79 + *plVar1;
                  auVar80._8_8_ = lVar51 + plVar1[1];
                  auVar54 = *(undefined1 (*) [16])((long)*ptr_00 + lVar18);
                  auVar92 = auVar80 ^ auVar74;
                  auVar85 = auVar54 ^ auVar74;
                  iVar19 = -(uint)(auVar85._0_4_ < auVar92._0_4_);
                  iVar90 = auVar85._4_4_;
                  auVar98._4_4_ = -(uint)(iVar90 < auVar92._4_4_);
                  iVar102 = -(uint)(auVar85._8_4_ < auVar92._8_4_);
                  iVar91 = auVar85._12_4_;
                  auVar98._12_4_ = -(uint)(iVar91 < auVar92._12_4_);
                  auVar105._4_4_ = iVar19;
                  auVar105._0_4_ = iVar19;
                  auVar105._8_4_ = iVar102;
                  auVar105._12_4_ = iVar102;
                  auVar93._4_4_ = -(uint)(auVar92._4_4_ == iVar90);
                  auVar93._12_4_ = -(uint)(auVar92._12_4_ == iVar91);
                  auVar93._0_4_ = auVar93._4_4_;
                  auVar93._8_4_ = auVar93._12_4_;
                  auVar98._0_4_ = auVar98._4_4_;
                  auVar98._8_4_ = auVar98._12_4_;
                  auVar98 = auVar98 | auVar93 & auVar105;
                  auVar99 = ~auVar98 & auVar54 | auVar80 & auVar98;
                  auVar81 = auVar99 ^ auVar74;
                  auVar94 = auVar72 ^ auVar74;
                  iVar19 = -(uint)(auVar94._0_4_ < auVar81._0_4_);
                  iVar96 = auVar94._4_4_;
                  iVar108 = -(uint)(iVar96 < auVar81._4_4_);
                  iVar102 = -(uint)(auVar94._8_4_ < auVar81._8_4_);
                  iVar97 = auVar94._12_4_;
                  iVar109 = -(uint)(iVar97 < auVar81._12_4_);
                  auVar92._4_4_ = iVar19;
                  auVar92._0_4_ = iVar19;
                  auVar92._8_4_ = iVar102;
                  auVar92._12_4_ = iVar102;
                  iVar19 = -(uint)(auVar81._4_4_ == iVar96);
                  iVar102 = -(uint)(auVar81._12_4_ == iVar97);
                  auVar55._4_4_ = iVar19;
                  auVar55._0_4_ = iVar19;
                  auVar55._8_4_ = iVar102;
                  auVar55._12_4_ = iVar102;
                  auVar82._4_4_ = iVar108;
                  auVar82._0_4_ = iVar108;
                  auVar82._8_4_ = iVar109;
                  auVar82._12_4_ = iVar109;
                  auVar82 = auVar82 | auVar55 & auVar92;
                  auVar99 = ~auVar82 & auVar72 | auVar99 & auVar82;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar18) = auVar99;
                  auVar92 = auVar67 ^ auVar74;
                  auVar81 = auVar99 ^ auVar74;
                  iVar108 = -(uint)(auVar81._0_4_ < auVar92._0_4_);
                  iVar19 = auVar81._4_4_;
                  auVar100._4_4_ = -(uint)(iVar19 < auVar92._4_4_);
                  iVar109 = -(uint)(auVar81._8_4_ < auVar92._8_4_);
                  iVar102 = auVar81._12_4_;
                  auVar100._12_4_ = -(uint)(iVar102 < auVar92._12_4_);
                  auVar106._4_4_ = iVar108;
                  auVar106._0_4_ = iVar108;
                  auVar106._8_4_ = iVar109;
                  auVar106._12_4_ = iVar109;
                  auVar66._4_4_ = -(uint)(auVar92._4_4_ == iVar19);
                  auVar66._12_4_ = -(uint)(auVar92._12_4_ == iVar102);
                  auVar66._0_4_ = auVar66._4_4_;
                  auVar66._8_4_ = auVar66._12_4_;
                  auVar100._0_4_ = auVar100._4_4_;
                  auVar100._8_4_ = auVar100._12_4_;
                  auVar100 = auVar100 | auVar66 & auVar106;
                  auVar67 = ~auVar100 & auVar99 | auVar67 & auVar100;
                  auVar92 = auVar40 ^ auVar74;
                  iVar108 = -(uint)(auVar92._0_4_ < auVar81._0_4_);
                  iVar109 = -(uint)(auVar92._4_4_ < iVar19);
                  iVar103 = -(uint)(auVar92._8_4_ < auVar81._8_4_);
                  iVar104 = -(uint)(auVar92._12_4_ < iVar102);
                  auVar107._4_4_ = iVar108;
                  auVar107._0_4_ = iVar108;
                  auVar107._8_4_ = iVar103;
                  auVar107._12_4_ = iVar103;
                  auVar81._4_4_ = -(uint)(auVar92._4_4_ == iVar19);
                  auVar81._12_4_ = -(uint)(auVar92._12_4_ == iVar102);
                  auVar81._0_4_ = auVar81._4_4_;
                  auVar81._8_4_ = auVar81._12_4_;
                  auVar56._4_4_ = iVar109;
                  auVar56._0_4_ = iVar109;
                  auVar56._8_4_ = iVar104;
                  auVar56._12_4_ = iVar104;
                  auVar56 = auVar56 | auVar81 & auVar107;
                  auVar92 = ~auVar56 & auVar99 | auVar40 & auVar56;
                  auVar40 = auVar92 ^ auVar74;
                  iVar19 = -(uint)(auVar40._0_4_ < auVar85._0_4_);
                  iVar102 = -(uint)(auVar40._4_4_ < iVar90);
                  iVar108 = -(uint)(auVar40._8_4_ < auVar85._8_4_);
                  iVar109 = -(uint)(auVar40._12_4_ < iVar91);
                  auVar101._4_4_ = iVar19;
                  auVar101._0_4_ = iVar19;
                  auVar101._8_4_ = iVar108;
                  auVar101._12_4_ = iVar108;
                  auVar85._4_4_ = -(uint)(auVar40._4_4_ == iVar90);
                  auVar85._12_4_ = -(uint)(auVar40._12_4_ == iVar91);
                  auVar85._0_4_ = auVar85._4_4_;
                  auVar85._8_4_ = auVar85._12_4_;
                  auVar86._4_4_ = iVar102;
                  auVar86._0_4_ = iVar102;
                  auVar86._8_4_ = iVar109;
                  auVar86._12_4_ = iVar109;
                  auVar86 = auVar86 | auVar85 & auVar101;
                  auVar92 = ~auVar86 & auVar54 | auVar92 & auVar86;
                  auVar40 = auVar92 ^ auVar74;
                  iVar19 = -(uint)(auVar40._0_4_ < auVar94._0_4_);
                  auVar46._4_4_ = -(uint)(auVar40._4_4_ < iVar96);
                  iVar102 = -(uint)(auVar40._8_4_ < auVar94._8_4_);
                  auVar46._12_4_ = -(uint)(auVar40._12_4_ < iVar97);
                  auVar57._4_4_ = iVar19;
                  auVar57._0_4_ = iVar19;
                  auVar57._8_4_ = iVar102;
                  auVar57._12_4_ = iVar102;
                  auVar94._4_4_ = -(uint)(auVar40._4_4_ == iVar96);
                  auVar94._12_4_ = -(uint)(auVar40._12_4_ == iVar97);
                  auVar94._0_4_ = auVar94._4_4_;
                  auVar94._8_4_ = auVar94._12_4_;
                  auVar46._0_4_ = auVar46._4_4_;
                  auVar46._8_4_ = auVar46._12_4_;
                  auVar46 = auVar46 | auVar94 & auVar57;
                  auVar40 = ~auVar46 & auVar72 | auVar92 & auVar46;
                  piVar5 = ((ppVar13->field_4).rowcols)->score_row;
                  *(int *)((long)piVar5 + lVar22) = auVar99._0_4_;
                  *(int *)((long)piVar5 + lVar33 + lVar22) = auVar99._8_4_;
                  auVar83._0_8_ = auVar99._0_8_ - (ulong)(uint)open;
                  auVar83._8_8_ = auVar99._8_8_ - (ulong)(uint)open;
                  auVar75._0_8_ = auVar54._0_8_ - (ulong)(uint)gap;
                  auVar75._8_8_ = auVar54._8_8_ - (ulong)(uint)gap;
                  auVar54 = auVar75 ^ auVar74;
                  auVar92 = auVar83 ^ auVar74;
                  iVar19 = -(uint)(auVar92._0_4_ < auVar54._0_4_);
                  iVar108 = auVar92._4_4_;
                  auVar58._4_4_ = -(uint)(iVar108 < auVar54._4_4_);
                  iVar102 = -(uint)(auVar92._8_4_ < auVar54._8_4_);
                  iVar109 = auVar92._12_4_;
                  auVar58._12_4_ = -(uint)(iVar109 < auVar54._12_4_);
                  auVar95._4_4_ = iVar19;
                  auVar95._0_4_ = iVar19;
                  auVar95._8_4_ = iVar102;
                  auVar95._12_4_ = iVar102;
                  auVar99._4_4_ = -(uint)(auVar54._4_4_ == iVar108);
                  auVar99._12_4_ = -(uint)(auVar54._12_4_ == iVar109);
                  auVar99._0_4_ = auVar99._4_4_;
                  auVar99._8_4_ = auVar99._12_4_;
                  auVar58._0_4_ = auVar58._4_4_;
                  auVar58._8_4_ = auVar58._12_4_;
                  auVar58 = auVar58 | auVar99 & auVar95;
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar18) =
                       ~auVar58 & auVar83 | auVar75 & auVar58;
                  auVar70._0_8_ = auVar72._0_8_ - (ulong)(uint)gap;
                  auVar70._8_8_ = auVar72._8_8_ - (ulong)(uint)gap;
                  auVar54 = auVar70 ^ auVar74;
                  iVar19 = -(uint)(auVar92._0_4_ < auVar54._0_4_);
                  auVar59._4_4_ = -(uint)(iVar108 < auVar54._4_4_);
                  iVar102 = -(uint)(auVar92._8_4_ < auVar54._8_4_);
                  auVar59._12_4_ = -(uint)(iVar109 < auVar54._12_4_);
                  auVar76._4_4_ = iVar19;
                  auVar76._0_4_ = iVar19;
                  auVar76._8_4_ = iVar102;
                  auVar76._12_4_ = iVar102;
                  auVar71._4_4_ = -(uint)(auVar54._4_4_ == iVar108);
                  auVar71._12_4_ = -(uint)(auVar54._12_4_ == iVar109);
                  auVar71._0_4_ = auVar71._4_4_;
                  auVar71._8_4_ = auVar71._12_4_;
                  auVar59._0_4_ = auVar59._4_4_;
                  auVar59._8_4_ = auVar59._12_4_;
                  auVar59 = auVar59 | auVar71 & auVar76;
                  auVar72 = ~auVar59 & auVar83 | auVar70 & auVar59;
                  plVar1 = (long *)((long)*ptr + lVar18);
                  iVar79 = *plVar1;
                  lVar51 = plVar1[1];
                  lVar18 = lVar18 + 0x10;
                  lVar22 = lVar22 + uVar29 * 4;
                } while (size << 4 != lVar18);
                bVar37 = true;
                do {
                  bVar32 = bVar37;
                  lVar22 = lVar16;
                  if (s2_beg == 0) {
                    lVar22 = ptr_01[uVar28 + 1] - uVar24;
                  }
                  auVar72._8_8_ = auVar72._0_8_;
                  auVar72._0_8_ = lVar22;
                  lVar18 = 0;
                  lVar22 = lVar36;
                  do {
                    auVar54 = *(undefined1 (*) [16])((long)*ptr_02 + lVar18);
                    auVar92 = auVar72 ^ auVar74;
                    auVar81 = auVar54 ^ auVar74;
                    iVar25 = -(uint)(auVar92._0_4_ < auVar81._0_4_);
                    iVar102 = -(uint)(auVar92._4_4_ < auVar81._4_4_);
                    iVar19 = -(uint)(auVar92._8_4_ < auVar81._8_4_);
                    iVar108 = -(uint)(auVar92._12_4_ < auVar81._12_4_);
                    auVar87._4_4_ = iVar25;
                    auVar87._0_4_ = iVar25;
                    auVar87._8_4_ = iVar19;
                    auVar87._12_4_ = iVar19;
                    iVar25 = -(uint)(auVar81._4_4_ == auVar92._4_4_);
                    iVar19 = -(uint)(auVar81._12_4_ == auVar92._12_4_);
                    auVar60._4_4_ = iVar25;
                    auVar60._0_4_ = iVar25;
                    auVar60._8_4_ = iVar19;
                    auVar60._12_4_ = iVar19;
                    auVar77._4_4_ = iVar102;
                    auVar77._0_4_ = iVar102;
                    auVar77._8_4_ = iVar108;
                    auVar77._12_4_ = iVar108;
                    auVar77 = auVar77 | auVar60 & auVar87;
                    auVar92 = ~auVar77 & auVar72 | auVar54 & auVar77;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar18) = auVar92;
                    auVar54 = auVar40 ^ auVar74;
                    auVar81 = auVar92 ^ auVar74;
                    iVar25 = -(uint)(auVar54._0_4_ < auVar81._0_4_);
                    iVar19 = auVar81._4_4_;
                    auVar61._4_4_ = -(uint)(auVar54._4_4_ < iVar19);
                    iVar108 = auVar81._12_4_;
                    iVar102 = -(uint)(auVar54._8_4_ < auVar81._8_4_);
                    auVar61._12_4_ = -(uint)(auVar54._12_4_ < iVar108);
                    auVar88._4_4_ = iVar25;
                    auVar88._0_4_ = iVar25;
                    auVar88._8_4_ = iVar102;
                    auVar88._12_4_ = iVar102;
                    auVar47._4_4_ = -(uint)(auVar54._4_4_ == iVar19);
                    auVar47._12_4_ = -(uint)(auVar54._12_4_ == iVar108);
                    auVar47._0_4_ = auVar47._4_4_;
                    auVar47._8_4_ = auVar47._12_4_;
                    auVar61._0_4_ = auVar61._4_4_;
                    auVar61._8_4_ = auVar61._12_4_;
                    auVar61 = auVar61 | auVar47 & auVar88;
                    auVar40 = ~auVar61 & auVar92 | auVar40 & auVar61;
                    auVar54 = auVar67 ^ auVar74;
                    iVar25 = -(uint)(auVar81._0_4_ < auVar54._0_4_);
                    auVar62._4_4_ = -(uint)(iVar19 < auVar54._4_4_);
                    iVar102 = -(uint)(auVar81._8_4_ < auVar54._8_4_);
                    auVar62._12_4_ = -(uint)(iVar108 < auVar54._12_4_);
                    auVar89._4_4_ = iVar25;
                    auVar89._0_4_ = iVar25;
                    auVar89._8_4_ = iVar102;
                    auVar89._12_4_ = iVar102;
                    auVar68._4_4_ = -(uint)(auVar54._4_4_ == iVar19);
                    auVar68._12_4_ = -(uint)(auVar54._12_4_ == iVar108);
                    auVar68._0_4_ = auVar68._4_4_;
                    auVar68._8_4_ = auVar68._12_4_;
                    auVar62._0_4_ = auVar62._4_4_;
                    auVar62._8_4_ = auVar62._12_4_;
                    auVar62 = auVar62 | auVar68 & auVar89;
                    auVar67 = ~auVar62 & auVar92 | auVar67 & auVar62;
                    piVar5 = ((ppVar13->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar22) = auVar92._0_4_;
                    lVar27 = (long)piVar5 + lVar22;
                    *(int *)(lVar33 + lVar27) = auVar92._8_4_;
                    auVar78._0_8_ = auVar92._0_8_ - (ulong)(uint)open;
                    auVar78._8_8_ = auVar92._8_8_ - (ulong)(uint)open;
                    lVar73 = auVar72._8_8_;
                    auVar72._0_8_ = auVar72._0_8_ - (ulong)(uint)gap;
                    auVar72._8_8_ = lVar73 - (ulong)(uint)gap;
                    auVar78 = auVar78 ^ auVar74;
                    auVar54 = auVar72 ^ auVar74;
                    iVar25 = -(uint)(auVar78._0_4_ < auVar54._0_4_);
                    auVar63._4_4_ = -(uint)(auVar78._4_4_ < auVar54._4_4_);
                    iVar19 = -(uint)(auVar78._8_4_ < auVar54._8_4_);
                    auVar63._12_4_ = -(uint)(auVar78._12_4_ < auVar54._12_4_);
                    auVar84._4_4_ = iVar25;
                    auVar84._0_4_ = iVar25;
                    auVar84._8_4_ = iVar19;
                    auVar84._12_4_ = iVar19;
                    auVar41._4_4_ = -(uint)(auVar54._4_4_ == auVar78._4_4_);
                    auVar41._12_4_ = -(uint)(auVar54._12_4_ == auVar78._12_4_);
                    auVar41._0_4_ = auVar41._4_4_;
                    auVar41._8_4_ = auVar41._12_4_;
                    auVar63._0_4_ = auVar63._4_4_;
                    auVar63._8_4_ = auVar63._12_4_;
                    iVar25 = movmskps((int)lVar27,auVar63 | auVar41 & auVar84);
                    if (iVar25 == 0) goto LAB_005c0e00;
                    lVar18 = lVar18 + 0x10;
                    lVar22 = lVar22 + uVar29 * 4;
                  } while (size << 4 != lVar18);
                  bVar37 = false;
                } while (bVar32);
LAB_005c0e00:
                lVar18 = auVar69._0_8_;
                lVar22 = ptr_02[uVar7][0];
                uVar6 = ptr_02[uVar7][1];
                uVar38 = auVar69._8_8_;
                uVar31 = uVar38;
                if ((long)uVar38 < (long)uVar6) {
                  uVar31 = uVar6;
                }
                lVar27 = lVar18;
                if (lVar18 < lVar22) {
                  lVar27 = lVar22;
                }
                auVar64._8_8_ = -(ulong)((long)uVar38 < (long)uVar6);
                auVar64._0_8_ = -(ulong)(lVar18 < lVar22);
                auVar64 = auVar64 & auVar65;
                auVar69._8_8_ = uVar31;
                auVar69._0_8_ = lVar27;
                if ((((((((((((((((auVar64 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar64 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar64 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar64 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar64 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar64 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar64 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar64 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar64 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar64 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar64 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar64 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar64[0xf] < '\0') {
                  local_110 = (int)uVar28;
                }
                uVar28 = uVar28 + 1;
                lVar36 = lVar36 + 4;
                palVar14 = ptr_02;
                if (uVar28 == uVar29) {
                  if ((s2_end != 0) && (uVar15 = uVar31, iVar53 < 1)) {
                    do {
                      uVar15 = auVar69._0_8_;
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = uVar15;
                      auVar69 = auVar10 << 0x40;
                    } while (iVar53 < 0);
                  }
                  uVar12 = uVar30;
                  if ((s1_end != 0) && ((uVar23 & 0x7ffffffe) != 0)) {
                    uVar23 = 0;
                    uVar29 = uVar15;
                    do {
                      uVar26 = 0;
                      if ((uVar23 & 1) != 0) {
                        uVar26 = uVar35;
                      }
                      uVar26 = uVar26 + ((uint)(uVar23 >> 1) & 0x7fffffff);
                      uVar15 = uVar29;
                      uVar11 = uVar12;
                      iVar25 = local_110;
                      if (((int)uVar26 < (int)uVar2) &&
                         (uVar15 = (*ptr_02)[uVar23], uVar11 = uVar26, iVar25 = iVar20,
                         (long)uVar15 <= (long)uVar29)) {
                        if ((int)uVar12 <= (int)uVar26) {
                          uVar26 = uVar12;
                        }
                        if (local_110 != iVar20) {
                          uVar26 = uVar12;
                        }
                        bVar37 = uVar15 == uVar29;
                        uVar15 = uVar29;
                        uVar11 = uVar12;
                        iVar25 = local_110;
                        if (bVar37) {
                          uVar11 = uVar26;
                        }
                      }
                      local_110 = iVar25;
                      uVar12 = uVar11;
                      uVar23 = uVar23 + 1;
                      uVar29 = uVar15;
                    } while ((uVar35 & 0x3fffffff) * 2 != (int)uVar23);
                  }
                  iVar25 = (int)uVar15;
                  if (s2_end == 0 && s1_end == 0) {
                    lVar51 = ptr_02[uVar7][0];
                    iVar25 = (int)ptr_02[uVar7][1];
                    uVar12 = uVar30;
                    local_110 = iVar20;
                    if (iVar53 < 1) {
                      do {
                        iVar25 = (int)lVar51;
                        lVar51 = 0;
                      } while (iVar53 < 0);
                    }
                  }
                  auVar42._8_4_ = (int)uVar34;
                  auVar42._0_8_ = uVar34;
                  auVar42._12_4_ = (int)(uVar34 >> 0x20);
                  auVar40 = auVar40 ^ auVar74;
                  auVar42 = auVar42 ^ auVar74;
                  iVar19 = -(uint)(auVar42._0_4_ < auVar40._0_4_);
                  iVar53 = -(uint)(auVar42._4_4_ < auVar40._4_4_);
                  iVar20 = -(uint)(auVar42._8_4_ < auVar40._8_4_);
                  iVar102 = -(uint)(auVar42._12_4_ < auVar40._12_4_);
                  auVar43._4_4_ = -(uint)(auVar42._4_4_ == auVar40._4_4_);
                  auVar43._12_4_ = -(uint)(auVar42._12_4_ == auVar40._12_4_);
                  auVar43._0_4_ = auVar43._4_4_;
                  auVar43._8_4_ = auVar43._12_4_;
                  auVar8._4_4_ = iVar19;
                  auVar8._0_4_ = iVar19;
                  auVar8._8_4_ = iVar20;
                  auVar8._12_4_ = iVar20;
                  auVar48._4_4_ = iVar53;
                  auVar48._0_4_ = iVar53;
                  auVar48._8_4_ = iVar102;
                  auVar48._12_4_ = iVar102;
                  auVar44._8_4_ = 0xffffffff;
                  auVar44._0_8_ = 0xffffffffffffffff;
                  auVar44._12_4_ = 0xffffffff;
                  auVar49._8_4_ = (int)local_48;
                  auVar49._0_8_ = local_48;
                  auVar49._12_4_ = uVar45;
                  auVar67 = auVar67 ^ auVar74;
                  auVar49 = auVar49 ^ auVar74;
                  iVar19 = -(uint)(auVar49._0_4_ < auVar67._0_4_);
                  auVar52._4_4_ = -(uint)(auVar49._4_4_ < auVar67._4_4_);
                  iVar53 = -(uint)(auVar49._8_4_ < auVar67._8_4_);
                  auVar52._12_4_ = -(uint)(auVar49._12_4_ < auVar67._12_4_);
                  auVar50._4_4_ = -(uint)(auVar49._4_4_ == auVar67._4_4_);
                  auVar50._12_4_ = -(uint)(auVar49._12_4_ == auVar67._12_4_);
                  auVar50._0_4_ = auVar50._4_4_;
                  auVar50._8_4_ = auVar50._12_4_;
                  auVar9._4_4_ = iVar19;
                  auVar9._0_4_ = iVar19;
                  auVar9._8_4_ = iVar53;
                  auVar9._12_4_ = iVar53;
                  auVar52._0_4_ = auVar52._4_4_;
                  auVar52._8_4_ = auVar52._12_4_;
                  auVar67 = auVar52 | auVar50 & auVar9 | auVar44 ^ (auVar48 | auVar43 & auVar8);
                  if ((((((((((((((((auVar67 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar67 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar67 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar67 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar67 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar67 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar67 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar67 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar67 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar67 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar67 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar67 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar67 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar67[0xf] < '\0') {
                    *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
                    iVar25 = 0;
                    local_110 = 0;
                    uVar12 = 0;
                  }
                  ppVar13->score = iVar25;
                  ppVar13->end_query = uVar12;
                  ppVar13->end_ref = local_110;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_02);
                  return ppVar13;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi64_rpl(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm_slli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi64_rpl(vH, vMaxH));
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}